

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPolygonOffsetTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::PolygonOffsetTests::init(PolygonOffsetTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  void *pvVar2;
  TestNode *pTVar3;
  char *pcVar4;
  allocator<char> local_289;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  undefined1 local_242;
  allocator<char> local_241;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  undefined1 local_1fa;
  allocator<char> local_1f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  undefined1 local_1b2;
  allocator<char> local_1b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  undefined1 local_16a;
  allocator<char> local_169;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  undefined1 local_122;
  allocator<char> local_121;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined1 local_dd;
  allocator<char> local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  GLenum *local_88;
  DepthBufferFormat *format;
  GLenum local_78;
  int ndx;
  DepthBufferFormat depthFormats [4];
  PolygonOffsetTests *this_local;
  
  pvVar2 = memcpy(&local_78,&DAT_0329f350,0x60);
  format._4_4_ = 0;
  while ((int)format._4_4_ < 4) {
    local_88 = &local_78 + (long)(int)format._4_4_ * 6;
    pTVar3 = (TestNode *)operator_new(0x90);
    local_dd = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar4 = *(char **)(local_88 + 4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,pcVar4,&local_c9);
    std::operator+(&local_a8,&local_c8,"_enable");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    Functional::anon_unknown_0::UsageTestCase::UsageTestCase
              ((UsageTestCase *)pTVar3,pCVar1,pcVar4,"test enable GL_POLYGON_OFFSET_FILL",*local_88,
               *(char **)(local_88 + 4));
    local_dd = 0;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    pTVar3 = (TestNode *)operator_new(0x90);
    local_122 = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar4 = *(char **)(local_88 + 4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,pcVar4,&local_121);
    std::operator+(&local_100,&local_120,"_displacement_with_units");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    Functional::anon_unknown_0::UsageDisplacementTestCase::UsageDisplacementTestCase
              ((UsageDisplacementTestCase *)pTVar3,pCVar1,pcVar4,"test polygon offset",*local_88,
               *(char **)(local_88 + 4));
    local_122 = 0;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator(&local_121);
    pTVar3 = (TestNode *)operator_new(0x90);
    local_16a = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar4 = *(char **)(local_88 + 4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,pcVar4,&local_169);
    std::operator+(&local_148,&local_168,"_render_with_units");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    Functional::anon_unknown_0::UsagePositiveNegativeTestCase::UsagePositiveNegativeTestCase
              ((UsagePositiveNegativeTestCase *)pTVar3,pCVar1,pcVar4,"test polygon offset",*local_88
               ,*(char **)(local_88 + 4));
    local_16a = 0;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator(&local_169);
    pTVar3 = (TestNode *)operator_new(0x90);
    local_1b2 = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar4 = *(char **)(local_88 + 4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,pcVar4,&local_1b1);
    std::operator+(&local_190,&local_1b0,"_result_depth_clamp");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    Functional::anon_unknown_0::ResultClampingTestCase::ResultClampingTestCase
              ((ResultClampingTestCase *)pTVar3,pCVar1,pcVar4,"test polygon offset clamping",
               *local_88,*(char **)(local_88 + 4));
    local_1b2 = 0;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::allocator<char>::~allocator(&local_1b1);
    pTVar3 = (TestNode *)operator_new(0x90);
    local_1fa = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar4 = *(char **)(local_88 + 4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,pcVar4,&local_1f9);
    std::operator+(&local_1d8,&local_1f8,"_render_with_factor");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    Functional::anon_unknown_0::UsageSlopeTestCase::UsageSlopeTestCase
              ((UsageSlopeTestCase *)pTVar3,pCVar1,pcVar4,"test polygon offset factor",*local_88,
               *(char **)(local_88 + 4));
    local_1fa = 0;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
    pTVar3 = (TestNode *)operator_new(0x90);
    local_242 = 1;
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar4 = *(char **)(local_88 + 4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,pcVar4,&local_241);
    std::operator+(&local_220,&local_240,"_factor_0_slope");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    Functional::anon_unknown_0::ZeroSlopeTestCase::ZeroSlopeTestCase
              ((ZeroSlopeTestCase *)pTVar3,pCVar1,pcVar4,"test polygon offset factor",*local_88,
               *(char **)(local_88 + 4));
    local_242 = 0;
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_240);
    std::allocator<char>::~allocator(&local_241);
    pTVar3 = (TestNode *)operator_new(0x90);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    pcVar4 = *(char **)(local_88 + 4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,pcVar4,&local_289);
    std::operator+(&local_268,&local_288,"_factor_1_slope");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    Functional::anon_unknown_0::OneSlopeTestCase::OneSlopeTestCase
              ((OneSlopeTestCase *)pTVar3,pCVar1,pcVar4,"test polygon offset factor",*local_88,
               *(char **)(local_88 + 4));
    tcu::TestNode::addChild((TestNode *)this,pTVar3);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_288);
    std::allocator<char>::~allocator(&local_289);
    format._4_4_ = format._4_4_ + 1;
    pvVar2 = (void *)(ulong)format._4_4_;
  }
  return (int)pvVar2;
}

Assistant:

void PolygonOffsetTests::init (void)
{
	const struct DepthBufferFormat
	{
		enum BufferType
		{
			TYPE_FIXED_POINT,
			TYPE_FLOATING_POINT,
			TYPE_UNKNOWN
		};

		GLenum		internalFormat;
		int			bits;
		BufferType	floatingPoint;
		const char* name;
	} depthFormats[]=
	{
		{ 0,						0,		DepthBufferFormat::TYPE_UNKNOWN,		"default" },
		{ GL_DEPTH_COMPONENT16,		16,		DepthBufferFormat::TYPE_FIXED_POINT,	"fixed16" },
		{ GL_DEPTH_COMPONENT24,		24,		DepthBufferFormat::TYPE_FIXED_POINT,	"fixed24" },
		{ GL_DEPTH_COMPONENT32F,	32,		DepthBufferFormat::TYPE_FLOATING_POINT,	"float32" },
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(depthFormats); ++ndx)
	{
		const DepthBufferFormat& format = depthFormats[ndx];

		// enable works?
		addChild(new UsageTestCase(m_context, (std::string(format.name) + "_enable").c_str(), "test enable GL_POLYGON_OFFSET_FILL", format.internalFormat, format.name));

		// Really moves the polygons ?
		addChild(new UsageDisplacementTestCase(m_context, (std::string(format.name) + "_displacement_with_units").c_str(), "test polygon offset", format.internalFormat, format.name));

		// Really moves the polygons to right direction ?
		addChild(new UsagePositiveNegativeTestCase(m_context, (std::string(format.name) + "_render_with_units").c_str(), "test polygon offset", format.internalFormat, format.name));

		// Is total result clamped to [0,1] like promised?
		addChild(new ResultClampingTestCase(m_context, (std::string(format.name) + "_result_depth_clamp").c_str(), "test polygon offset clamping", format.internalFormat, format.name));

		// Slope really moves the polygon?
		addChild(new UsageSlopeTestCase(m_context, (std::string(format.name) + "_render_with_factor").c_str(), "test polygon offset factor", format.internalFormat, format.name));

		// Factor with zero slope
		addChild(new ZeroSlopeTestCase(m_context, (std::string(format.name) + "_factor_0_slope").c_str(), "test polygon offset factor", format.internalFormat, format.name));

		// Factor with 1.0 slope
		addChild(new OneSlopeTestCase(m_context, (std::string(format.name) + "_factor_1_slope").c_str(), "test polygon offset factor", format.internalFormat, format.name));
	}
}